

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alhelpers.c
# Opt level: O0

int altime_get(void)

{
  int iVar1;
  int ret;
  timespec ts;
  int cur_time;
  timespec local_18;
  int local_4;
  
  iVar1 = clock_gettime(0,&local_18);
  if (iVar1 == 0) {
    local_4 = (int)local_18.tv_sec * 1000 + (int)(local_18.tv_nsec / 1000000);
    if (altime_get::start_time == 0) {
      altime_get::start_time = local_4;
    }
    local_4 = local_4 - altime_get::start_time;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int altime_get(void)
{
    static int start_time = 0u;
    int cur_time;

#if _POSIX_TIMERS > 0
    struct timespec ts;
    int ret = clock_gettime(CLOCK_REALTIME, &ts);
    if(ret != 0) return 0;
    cur_time = (int)(ts.tv_sec*1000 + ts.tv_nsec/1000000);
#else /* _POSIX_TIMERS > 0 */
    struct timeval tv;
    int ret = gettimeofday(&tv, NULL);
    if(ret != 0) return 0;
    cur_time = (int)(tv.tv_sec*1000 + tv.tv_usec/1000);
#endif

    if(!start_time)
        start_time = cur_time;
    return cur_time - start_time;
}